

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_division
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis,
          vec<16U,_float> *centroid,weighted_vec_array *vecs,vector<unsigned_int> *indices,
          vector<unsigned_int> *left_indices,vector<unsigned_int> *right_indices)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  weighted_vec *pwVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint i;
  long lVar10;
  vector<unsigned_int> *this_00;
  uint uVar11;
  ulong uVar12;
  float fVar13;
  vec<16U,_float> v;
  float local_70 [16];
  
  if (left_indices->m_size != 0) {
    left_indices->m_size = 0;
  }
  if (right_indices->m_size != 0) {
    right_indices->m_size = 0;
  }
  if (indices->m_size != 0) {
    uVar12 = 0;
    do {
      uVar3 = indices->m_p[uVar12];
      pwVar4 = vecs->m_p;
      lVar10 = 0;
      do {
        pfVar1 = pwVar4[uVar3].m_vec.m_s + lVar10;
        fVar13 = pfVar1[1];
        fVar5 = pfVar1[2];
        fVar6 = pfVar1[3];
        pfVar2 = centroid->m_s + lVar10;
        fVar7 = pfVar2[1];
        fVar8 = pfVar2[2];
        fVar9 = pfVar2[3];
        local_70[lVar10] = *pfVar1 - *pfVar2;
        local_70[lVar10 + 1] = fVar13 - fVar7;
        local_70[lVar10 + 2] = fVar5 - fVar8;
        local_70[lVar10 + 3] = fVar6 - fVar9;
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x10);
      fVar13 = local_70[0] * axis->m_s[0];
      lVar10 = 1;
      do {
        fVar13 = fVar13 + local_70[lVar10] * axis->m_s[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x10);
      if (0.0 <= fVar13) {
        uVar11 = right_indices->m_size;
        this_00 = right_indices;
        if (right_indices->m_capacity <= uVar11) goto LAB_0013f442;
      }
      else {
        uVar11 = left_indices->m_size;
        this_00 = left_indices;
        if (left_indices->m_capacity <= uVar11) {
LAB_0013f442:
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar11 + 1,true,4,(object_mover)0x0,false);
          uVar11 = this_00->m_size;
        }
      }
      this_00->m_p[uVar11] = uVar3;
      this_00->m_size = this_00->m_size + 1;
      uVar12 = uVar12 + 1;
    } while (uVar12 < indices->m_size);
  }
  return;
}

Assistant:

void compute_division(
            const VectorType& axis, const VectorType& centroid, const weighted_vec_array& vecs, const vector<uint>& indices,
            vector<uint>& left_indices,
            vector<uint>& right_indices)
        {
            left_indices.resize(0);
            right_indices.resize(0);

            for (uint i = 0; i < indices.size(); i++)
            {
                const uint vec_index = indices[i];
                const VectorType v(vecs[vec_index].m_vec - centroid);

                float t = v * axis;
                if (t < 0.0f)
                {
                    left_indices.push_back(vec_index);
                }
                else
                {
                    right_indices.push_back(vec_index);
                }
            }
        }